

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

Box<Dims> * adios2::helper::StartEndBox(Dims *start,Dims *count,bool reverse)

{
  size_type sVar1;
  const_reference pvVar2;
  byte in_CL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Box<Dims> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000018;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000020;
  size_t d;
  size_t size;
  Box<Dims> *box;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  ulong local_30;
  
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (in_stack_ffffffffffffff80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_00000020,in_stack_00000018);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    in_stack_ffffffffffffff88._M_current = (unsigned_long *)&in_RDI->second;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_30)
    ;
    in_stack_ffffffffffffff90._M_current = (unsigned_long *)*pvVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&in_stack_ffffffffffffff80->first,(value_type *)in_stack_ffffffffffffff78);
  }
  if ((in_CL & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff78);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff78);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

Box<Dims> StartEndBox(const Dims &start, const Dims &count, const bool reverse) noexcept
{
    Box<Dims> box;
    box.first = start;
    const size_t size = start.size();
    box.second.reserve(size);

    for (size_t d = 0; d < size; ++d)
    {
        box.second.push_back(start[d] + count[d] - 1); // end inclusive
    }

    if (reverse)
    {
        std::reverse(box.first.begin(), box.first.end());
        std::reverse(box.second.begin(), box.second.end());
    }

    return box;
}